

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

bool AString_reserve(AString *str,size_t reserveSize)

{
  ulong uVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  char *tmpBuffer;
  double multiplierExponent;
  size_t aimedCapacity;
  size_t reserveSize_local;
  AString *str_local;
  
  if (str != (AString *)0x0) {
    if (reserveSize <= str->capacity) {
      return true;
    }
    multiplierExponent = 3.95252516672997e-323;
    if (7 < reserveSize) {
      auVar5._8_4_ = (int)(reserveSize >> 0x20);
      auVar5._0_8_ = reserveSize;
      auVar5._12_4_ = 0x45300000;
      dVar3 = log(((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)reserveSize) - 4503599627370496.0)) * 0.5);
      dVar4 = log(2.0);
      dVar3 = ceil(dVar3 / dVar4);
      dVar3 = pow(2.0,dVar3);
      uVar1 = (ulong)(dVar3 + dVar3);
      multiplierExponent =
           (double)(uVar1 | (long)((dVar3 + dVar3) - 9.223372036854776e+18) & (long)uVar1 >> 0x3f);
      if (0x400 < (long)multiplierExponent - reserveSize) {
        multiplierExponent = (double)(reserveSize + 0x400);
      }
    }
    if ((reserveSize <= (ulong)multiplierExponent) &&
       (pcVar2 = (char *)(*str->reallocator)(str->buffer,(long)multiplierExponent + 1),
       pcVar2 != (char *)0x0)) {
      str->capacity = (size_t)multiplierExponent;
      str->buffer = pcVar2;
      return true;
    }
  }
  return false;
}

Assistant:

ACUTILS_HD_FUNC bool AString_reserve(struct AString *str, size_t reserveSize)
{
    if(str != nullptr) {
        if(reserveSize > str->capacity) {
            size_t aimedCapacity = private_ACUtils_AString_capacityMin;
            if(reserveSize >= private_ACUtils_AString_capacityMin) {
                double multiplierExponent =
                        (ceil(log((double) reserveSize / 2) / log(private_ACUtils_AString_capacityMul)));
                aimedCapacity = (size_t) (2 * pow((double) private_ACUtils_AString_capacityMul, multiplierExponent));
                if(aimedCapacity - reserveSize > private_ACUtils_AString_capacityAllocMax)
                    aimedCapacity = reserveSize + private_ACUtils_AString_capacityAllocMax;
            }
            if(aimedCapacity >= reserveSize) {
                char *tmpBuffer = (char*) str->reallocator(str->buffer, (aimedCapacity + 1) * sizeof(char));
                if(tmpBuffer != nullptr) {
                    str->capacity = aimedCapacity;
                    str->buffer = tmpBuffer;
                    return true;
                }
            }
        } else {
            return true;
        }
    }
    return false;
}